

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O0

void __thiscall Assimp::Ogre::MeshXml::ConvertToAssimpScene(MeshXml *this,aiScene *dest)

{
  undefined1 auVar1 [16];
  bool bVar2;
  size_t sVar3;
  aiMesh **ppaVar4;
  aiNode *paVar5;
  ulong uVar6;
  uint *puVar7;
  reference ppSVar8;
  aiMesh *paVar9;
  size_type sVar10;
  aiNode **ppaVar11;
  reference ppBVar12;
  aiAnimation **ppaVar13;
  reference ppAVar14;
  aiAnimation *paVar15;
  size_t len_1;
  size_t i_2;
  size_t len;
  size_t i_1;
  BoneList rootBones;
  size_t i;
  aiScene *dest_local;
  MeshXml *this_local;
  
  sVar3 = NumSubMeshes(this);
  dest->mNumMeshes = (uint)sVar3;
  ppaVar4 = (aiMesh **)operator_new__((ulong)dest->mNumMeshes << 3);
  dest->mMeshes = ppaVar4;
  paVar5 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar5);
  dest->mRootNode = paVar5;
  dest->mRootNode->mNumMeshes = dest->mNumMeshes;
  auVar1 = ZEXT416(dest->mRootNode->mNumMeshes) * ZEXT816(4);
  uVar6 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  puVar7 = (uint *)operator_new__(uVar6);
  dest->mRootNode->mMeshes = puVar7;
  for (rootBones.super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      rootBones.super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage < (pointer)(ulong)dest->mNumMeshes;
      rootBones.super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)rootBones.
                           super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1)) {
    ppSVar8 = std::vector<Assimp::Ogre::SubMeshXml_*,_std::allocator<Assimp::Ogre::SubMeshXml_*>_>::
              operator[](&this->subMeshes,
                         (size_type)
                         rootBones.
                         super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    paVar9 = SubMeshXml::ConvertToAssimpMesh(*ppSVar8,this);
    dest->mMeshes
    [(long)rootBones.super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage] = paVar9;
    dest->mRootNode->mMeshes
    [(long)rootBones.super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage] =
         (uint)rootBones.
               super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  if (this->skeleton != (Skeleton *)0x0) {
    bVar2 = std::vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>::empty
                      (&this->skeleton->bones);
    if (!bVar2) {
      Skeleton::RootBones((BoneList *)&i_1,this->skeleton);
      sVar10 = std::vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>::size
                         ((BoneList *)&i_1);
      dest->mRootNode->mNumChildren = (uint)sVar10;
      ppaVar11 = (aiNode **)operator_new__((ulong)dest->mRootNode->mNumChildren << 3);
      dest->mRootNode->mChildren = ppaVar11;
      len = 0;
      sVar10 = std::vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>::size
                         ((vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_> *)
                          &i_1);
      for (; len < sVar10; len = len + 1) {
        ppBVar12 = std::vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>::
                   operator[]((vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_> *
                              )&i_1,len);
        paVar5 = Bone::ConvertToAssimpNode(*ppBVar12,this->skeleton,dest->mRootNode);
        dest->mRootNode->mChildren[len] = paVar5;
      }
      std::vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>::~vector
                ((vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_> *)&i_1);
    }
    bVar2 = std::vector<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>::
            empty(&this->skeleton->animations);
    if (!bVar2) {
      sVar10 = std::vector<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>::
               size(&this->skeleton->animations);
      dest->mNumAnimations = (uint)sVar10;
      auVar1 = ZEXT416(dest->mNumAnimations) * ZEXT816(8);
      uVar6 = auVar1._0_8_;
      if (auVar1._8_8_ != 0) {
        uVar6 = 0xffffffffffffffff;
      }
      ppaVar13 = (aiAnimation **)operator_new__(uVar6);
      dest->mAnimations = ppaVar13;
      len_1 = 0;
      sVar10 = std::vector<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>::
               size(&this->skeleton->animations);
      for (; len_1 < sVar10; len_1 = len_1 + 1) {
        ppAVar14 = std::
                   vector<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>::
                   operator[](&this->skeleton->animations,len_1);
        paVar15 = Ogre::Animation::ConvertToAssimpAnimation(*ppAVar14);
        dest->mAnimations[len_1] = paVar15;
      }
    }
  }
  return;
}

Assistant:

void MeshXml::ConvertToAssimpScene(aiScene* dest)
{
    // Setup
    dest->mNumMeshes = static_cast<unsigned int>(NumSubMeshes());
    dest->mMeshes = new aiMesh*[dest->mNumMeshes];

    // Create root node
    dest->mRootNode = new aiNode();
    dest->mRootNode->mNumMeshes = dest->mNumMeshes;
    dest->mRootNode->mMeshes = new unsigned int[dest->mRootNode->mNumMeshes];

    // Export meshes
    for(size_t i=0; i<dest->mNumMeshes; ++i)
    {
        dest->mMeshes[i] = subMeshes[i]->ConvertToAssimpMesh(this);
        dest->mRootNode->mMeshes[i] = static_cast<unsigned int>(i);
    }

    // Export skeleton
    if (skeleton)
    {
        // Bones
        if (!skeleton->bones.empty())
        {
            BoneList rootBones = skeleton->RootBones();
            dest->mRootNode->mNumChildren = static_cast<unsigned int>(rootBones.size());
            dest->mRootNode->mChildren = new aiNode*[dest->mRootNode->mNumChildren];

            for(size_t i=0, len=rootBones.size(); i<len; ++i)
            {
                dest->mRootNode->mChildren[i] = rootBones[i]->ConvertToAssimpNode(skeleton, dest->mRootNode);
            }
        }

        // Animations
        if (!skeleton->animations.empty())
        {
            dest->mNumAnimations = static_cast<unsigned int>(skeleton->animations.size());
            dest->mAnimations = new aiAnimation*[dest->mNumAnimations];

            for(size_t i=0, len=skeleton->animations.size(); i<len; ++i)
            {
                dest->mAnimations[i] = skeleton->animations[i]->ConvertToAssimpAnimation();
            }
        }
    }
}